

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.h
# Opt level: O3

void __thiscall
UnifiedRegex::CharSet<unsigned_int>::CloneSurrogateCodeUnitsTo
          (CharSet<unsigned_int> *this,ArenaAllocator *allocator,CharSet<char16_t> *other)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined8 in_RAX;
  undefined4 *puVar7;
  undefined1 auStack_38 [6];
  Char local_32 [3];
  char16 ignore;
  char16 outLower;
  
  pCVar1 = this->characterPlanes[0].rep.full.root;
  _auStack_38 = in_RAX;
  if (&DAT_00000004 < (undefined1 *)((long)&pCVar1[-1]._vptr_CharSetNode + 7)) {
    if (pCVar1 == (CharSetNode *)0x0) {
      uVar4 = CharBitvec::Count(&this->characterPlanes[0].rep.full.direct);
    }
    else {
      if (pCVar1 != (CharSetNode *)&CharSetFull::Instance) {
        uVar5 = (*pCVar1->_vptr_CharSetNode[0xb])(pCVar1,2);
        if (0xff00 < uVar5) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x252,
                             "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                             ,
                             "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                            );
          if (!bVar3) goto LAB_00edea93;
          *puVar7 = 0;
        }
      }
      uVar4 = CharBitvec::Count(&this->characterPlanes[0].rep.full.direct);
      pCVar1 = this->characterPlanes[0].rep.full.root;
      if (pCVar1 == (CharSetNode *)&CharSetFull::Instance) {
        iVar6 = 0xff00;
      }
      else {
        iVar6 = (*pCVar1->_vptr_CharSetNode[0xb])(pCVar1,2);
      }
      uVar4 = iVar6 + uVar4;
    }
  }
  else {
    uVar4 = (int)pCVar1 - 1;
  }
  if (uVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x291,"(this->SimpleCharCount() > 0)","this->SimpleCharCount() > 0");
    if (!bVar3) goto LAB_00edea93;
    *puVar7 = 0;
  }
  auStack_38 = (undefined1  [6])((uint6)auStack_38 & 0xffffffff);
  _auStack_38 = CONCAT26(0xffff,auStack_38);
  bVar3 = CharSet<char16_t>::GetNextRange
                    (this->characterPlanes,L'\xd800',(Char *)(auStack_38 + 6),
                     (Char *)(auStack_38 + 4));
  if ((!bVar3) || (0xdfff < (ushort)local_32[0])) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x292,"(this->ContainSurrogateCodeUnits())",
                       "This doesn\'t contain surrogate code units, will not produce any result.");
    if (!bVar3) {
LAB_00edea93:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  CharSet<char16_t>::CloneSurrogateCodeUnitsTo(this->characterPlanes,allocator,other);
  return;
}

Assistant:

inline void CloneSurrogateCodeUnitsTo(ArenaAllocator* allocator, CharSet<char16>& other)
        {
            Assert(this->SimpleCharCount() > 0);
            AssertMsg(this->ContainSurrogateCodeUnits(), "This doesn't contain surrogate code units, will not produce any result.");
            this->characterPlanes[0].CloneSurrogateCodeUnitsTo(allocator, other);
        }